

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

void __thiscall
ddd::DictionarySGL<true,_true>::enumerate
          (DictionarySGL<true,_true> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_00000028;
  string *in_stack_00000030;
  uint32_t in_stack_0000003c;
  DaTrie<true,_true,_false> *in_stack_00000040;
  string local_30 [8];
  size_type in_stack_ffffffffffffffd8;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffffe0;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x1656f2);
  std::
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                *)0x165700);
  bVar1 = DaTrie<true,_true,_false>::is_empty((DaTrie<true,_true,_false> *)0x165708);
  if (!bVar1) {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::
    unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                  *)0x165731);
    std::__cxx11::string::string(local_30);
    DaTrie<true,_true,_false>::enumerate
              (in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_00000028);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (trie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);
    trie_->enumerate(ROOT_POS, std::string(), kvs);
  }